

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::set_slice_var_parent(Var **var,Var *target,Var *new_var,bool check_target)

{
  _func_int **pp_Var1;
  InternalException *pIVar2;
  Var *pVVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<kratos::Var> sVar5;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_a8;
  Var *local_98;
  Var **local_90;
  undefined1 auStack_88 [8];
  shared_ptr<kratos::VarSlice> slice;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  slices;
  undefined1 local_58 [8];
  shared_ptr<kratos::Var> new_var_ptr;
  
  auStack_88 = (undefined1  [8])0x0;
  slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pVVar3 = *var;
  slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = new_var;
  local_90 = var;
  while (pVVar3->type_ == Slice) {
    Var::as<kratos::VarSlice>((Var *)local_58);
    std::__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
               (__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_var_ptr);
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::emplace_back<std::shared_ptr<kratos::VarSlice>&>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(shared_ptr<kratos::VarSlice> *)auStack_88);
    pVVar3 = *(Var **)((long)auStack_88 + 0x270);
  }
  if (pVVar3 == target) {
    if (auStack_88 == (undefined1  [8])0x0) {
      pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"Slice cannot be null",(allocator<char> *)&local_a8);
      InternalException::InternalException(pIVar2,(string *)local_58);
      __cxa_throw(pIVar2,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar5 = Var::as<kratos::Var>((Var *)local_58);
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarSlice>*,std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>>>
              (slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,0,sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi._M_pi);
    for (_Var4 = slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        _Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Var4._M_pi = _Var4._M_pi + 1) {
      pp_Var1 = (_Var4._M_pi)->_vptr__Sp_counted_base;
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,(__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      (**(code **)(*pp_Var1 + 0xf0))(&local_a8,pp_Var1,&local_b8);
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_58,&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    }
    *local_90 = (Var *)local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_var_ptr);
  }
  else if (check_target) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"Target not found",(allocator<char> *)&local_a8);
    InternalException::InternalException(pIVar2,(string *)local_58);
    __cxa_throw(pIVar2,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *)&slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&slice);
  return;
}

Assistant:

void set_slice_var_parent(Var *&var, Var *target, Var *new_var, bool check_target) {
    std::shared_ptr<VarSlice> slice;
    Var *parent_var = var;
    std::vector<std::shared_ptr<VarSlice>> slices;
    while (parent_var->type() == VarType::Slice) {
        // this is for nested slicing
        slice = parent_var->as<VarSlice>();
        slices.emplace_back(slice);
        parent_var = slice->parent_var;
    }
    if (parent_var != target) {
        if (check_target)
            throw InternalException("Target not found");
        else
            return;
    }
    if (!slice) throw InternalException("Slice cannot be null");

    auto new_var_ptr = new_var->as<Var>();
    std::reverse(slices.begin(), slices.end());
    for (auto const &s : slices) {
        new_var_ptr = s->slice_var(new_var_ptr);
    }
    var = new_var_ptr.get();
}